

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O1

void * FIX::ThreadedSocketAcceptor::socketConnectionThread(void *p)

{
  socket_handle s;
  ThreadedSocketAcceptor *this;
  ThreadedSocketConnection *this_00;
  ssize_t sVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  undefined8 uVar2;
  
  this = *p;
  this_00 = *(ThreadedSocketConnection **)((long)p + 8);
  uVar2 = 0x10;
  operator_delete(p,0x10);
  s = this_00->m_socket;
  __buf = extraout_RDX;
  do {
    sVar1 = ThreadedSocketConnection::read(this_00,(int)uVar2,__buf,in_RCX);
    __buf = extraout_RDX_00;
  } while ((char)sVar1 != '\0');
  (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
  if (((this->super_Acceptor).m_stop._M_base._M_i & 1U) == 0) {
    removeThread(this,s);
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC ThreadedSocketAcceptor::socketConnectionThread(void *p) {
  ConnectionThreadInfo *info = reinterpret_cast<ConnectionThreadInfo *>(p);

  ThreadedSocketAcceptor *pAcceptor = info->m_pAcceptor;
  ThreadedSocketConnection *pConnection = info->m_pConnection;
  delete info;

  socket_handle socket = pConnection->getSocket();

  while (pConnection->read()) {}
  delete pConnection;
  if (!pAcceptor->isStopped()) {
    pAcceptor->removeThread(socket);
  }
  return 0;
}